

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::GenerateCheckObjType(Lowerer *this,Instr *instrChkObjType)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint sourceContextId;
  uint functionId;
  SymOpnd *this_00;
  undefined4 *puVar5;
  PropertySymOpnd *this_01;
  PropertySym *pPVar6;
  char16 *pcVar7;
  JITTimeFunctionBody *this_02;
  char16 *pcVar8;
  LabelInstr *labelObjCheckFailed;
  LabelInstr *branchTarget;
  BranchInstr *instr;
  BailOutInfo *pBVar9;
  Lowerer *this_03;
  char16_t *pcVar10;
  
  bVar4 = IR::Opnd::IsSymOpnd(instrChkObjType->m_src1);
  if (bVar4) {
    this_00 = IR::Opnd::AsSymOpnd(instrChkObjType->m_src1);
    bVar4 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (!bVar4) goto LAB_005467f9;
  }
  else {
LAB_005467f9:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x191d,
                       "(instrChkObjType->GetSrc1()->IsSymOpnd() && instrChkObjType->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())"
                       ,
                       "instrChkObjType->GetSrc1()->IsSymOpnd() && instrChkObjType->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()"
                      );
    if (!bVar4) goto LAB_00546aea;
    *puVar5 = 0;
  }
  this_01 = IR::Opnd::AsPropertySymOpnd(instrChkObjType->m_src1);
  bVar4 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01);
  if ((!bVar4) || (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 8) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1922,
                       "(propertySymOpnd->IsTypeCheckSeqCandidate() && !propertySymOpnd->IsTypeChecked())"
                       ,
                       "propertySymOpnd->IsTypeCheckSeqCandidate() && !propertySymOpnd->IsTypeChecked()"
                      );
    if (!bVar4) goto LAB_00546aea;
    *puVar5 = 0;
  }
  bVar4 = IR::PropertySymOpnd::IsRootObjectNonConfigurableFieldLoad(this_01);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1924,"(!propertySymOpnd->IsRootObjectNonConfigurableFieldLoad())",
                       "!propertySymOpnd->IsRootObjectNonConfigurableFieldLoad()");
    if (!bVar4) goto LAB_00546aea;
    *puVar5 = 0;
  }
  pPVar6 = Sym::AsPropertySym((this_01->super_SymOpnd).m_sym);
  uVar1 = this_01->m_inlineCacheIndex;
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,ObjTypeSpecPhase,sourceContextId,functionId)
  ;
  if (bVar4) {
    pcVar7 = Js::OpCodeUtil::GetOpCodeName(instrChkObjType->m_opcode);
    uVar2 = pPVar6->m_propertyId;
    this_02 = Func::GetJITFunctionBody(this->m_func);
    pcVar8 = JITTimeFunctionBody::GetDisplayName(this_02);
    pcVar10 = L"ObjTypeSpecFldInfo";
    if (this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
      pcVar10 = L"empty";
    }
    Output::Print(L"Object type check: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"
                  ,pcVar7,(ulong)uVar2,pcVar8,(ulong)uVar1,pcVar10,L"false");
    Output::Flush();
  }
  labelObjCheckFailed = IR::LabelInstr::New(Label,this->m_func,true);
  GenerateCachedTypeCheck
            (this,instrChkObjType,this_01,labelObjCheckFailed,labelObjCheckFailed,(LabelInstr *)0x0)
  ;
  branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
  instr = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
  IR::Instr::InsertBefore(instrChkObjType,&instr->super_Instr);
  IR::Instr::InsertBefore(instrChkObjType,&labelObjCheckFailed->super_Instr);
  this_03 = (Lowerer *)instrChkObjType;
  IR::Instr::InsertAfter(instrChkObjType,&branchTarget->super_Instr);
  if (((ushort)this_01->field_12 & 8) != 0) {
    GenerateAuxSlotPtrLoad(this_03,this_01,(branchTarget->super_Instr).m_next);
  }
  if ((instrChkObjType->field_0x38 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1943,"(instrChkObjType->HasBailOutInfo())",
                       "instrChkObjType->HasBailOutInfo()");
    if (!bVar4) {
LAB_00546aea:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pBVar9 = IR::Instr::GetBailOutInfo(instrChkObjType);
  if (pBVar9->bailOutInstr != instrChkObjType) {
    pBVar9 = IR::Instr::GetBailOutInfo(instrChkObjType);
    pBVar9->polymorphicCacheIndex = uVar1;
  }
  IR::Instr::FreeSrc1(instrChkObjType);
  instrChkObjType->m_opcode = BailOut;
  GenerateBailOut(this,instrChkObjType,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  return;
}

Assistant:

void
Lowerer::GenerateCheckObjType(IR::Instr * instrChkObjType)
{
    Assert(instrChkObjType->GetSrc1()->IsSymOpnd() && instrChkObjType->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd());
    IR::PropertySymOpnd *propertySymOpnd = instrChkObjType->GetSrc1()->AsPropertySymOpnd();

    // Why do we have an explicit type check if the cached type has been checked upstream?  The dead store pass should have
    // removed this instruction.
    Assert(propertySymOpnd->IsTypeCheckSeqCandidate() && !propertySymOpnd->IsTypeChecked());
    // Why do we have an explicit type check on a non-configurable root field load?
    Assert(!propertySymOpnd->IsRootObjectNonConfigurableFieldLoad());

    PropertySym * propertySym = propertySymOpnd->m_sym->AsPropertySym();
    uint inlineCacheIndex = propertySymOpnd->m_inlineCacheIndex;

    PHASE_PRINT_TESTTRACE(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Object type check: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"),
        Js::OpCodeUtil::GetOpCodeName(instrChkObjType->m_opcode),
        propertySym->m_propertyId,
        this->m_func->GetJITFunctionBody()->GetDisplayName(),
        inlineCacheIndex, propertySymOpnd->GetCacheLayoutString(), _u("false"));

    IR::LabelInstr* labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    this->GenerateCachedTypeCheck(instrChkObjType, propertySymOpnd, labelBailOut, labelBailOut);
    IR::LabelInstr* labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    IR::Instr* instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func);
    instrChkObjType->InsertBefore(instr);

    // Insert the bailout label here.
    instrChkObjType->InsertBefore(labelBailOut);
    instrChkObjType->InsertAfter(labelDone);

    if (propertySymOpnd->ProducesAuxSlotPtr())
    {
        this->GenerateAuxSlotPtrLoad(propertySymOpnd, labelDone->m_next);
    }

    // Convert the original instruction to a bailout.
    Assert(instrChkObjType->HasBailOutInfo());

    if (instrChkObjType->GetBailOutInfo()->bailOutInstr != instrChkObjType)
    {
        // Set the cache index in the bailout info so that the bailout code will write it into the
        // bailout record at runtime.
        instrChkObjType->GetBailOutInfo()->polymorphicCacheIndex = inlineCacheIndex;
    }

    instrChkObjType->FreeSrc1();
    instrChkObjType->m_opcode = Js::OpCode::BailOut;
    this->GenerateBailOut(instrChkObjType);
}